

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.cc
# Opt level: O2

size_t __thiscall
CoreML::Specification::NonMaximumSuppression::ByteSizeLong(NonMaximumSuppression *this)

{
  string *psVar1;
  uint uVar2;
  size_t sVar3;
  size_t sVar4;
  
  psVar1 = (this->confidenceinputfeaturename_).ptr_;
  if (psVar1->_M_string_length == 0) {
    sVar3 = 0;
  }
  else {
    sVar3 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar3 = sVar3 + 2;
  }
  psVar1 = (this->coordinatesinputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar3 = sVar3 + sVar4 + 2;
  }
  psVar1 = (this->iouthresholdinputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar3 = sVar3 + sVar4 + 2;
  }
  psVar1 = (this->confidencethresholdinputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar3 = sVar3 + sVar4 + 2;
  }
  psVar1 = (this->confidenceoutputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar3 = sVar3 + sVar4 + 2;
  }
  psVar1 = (this->coordinatesoutputfeaturename_).ptr_;
  if (psVar1->_M_string_length != 0) {
    sVar4 = google::protobuf::internal::WireFormatLite::StringSize(psVar1);
    sVar3 = sVar3 + sVar4 + 2;
  }
  sVar4 = sVar3;
  if (this->iouthreshold_ != 0.0) {
    sVar4 = sVar3 + 10;
  }
  if (NAN(this->iouthreshold_)) {
    sVar4 = sVar3 + 10;
  }
  sVar3 = sVar4;
  if (this->confidencethreshold_ != 0.0) {
    sVar3 = sVar4 + 10;
  }
  if (NAN(this->confidencethreshold_)) {
    sVar3 = sVar4 + 10;
  }
  if (this->_oneof_case_[0] == 1) {
    uVar2 = (uint)((this->SuppressionMethod_).picktop_)->perclass_ * 2;
    ((this->SuppressionMethod_).picktop_)->_cached_size_ = uVar2;
    sVar3 = sVar3 + uVar2 + 2;
  }
  if (this->_oneof_case_[1] == 0x65) {
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::Int64Vector>
                      ((this->ClassLabels_).int64classlabels_);
  }
  else {
    if (this->_oneof_case_[1] != 100) goto LAB_001ef82c;
    sVar4 = google::protobuf::internal::WireFormatLite::
            MessageSizeNoVirtual<CoreML::Specification::StringVector>
                      ((this->ClassLabels_).stringclasslabels_);
  }
  sVar3 = sVar3 + sVar4 + 2;
LAB_001ef82c:
  this->_cached_size_ = (int)sVar3;
  return sVar3;
}

Assistant:

size_t NonMaximumSuppression::ByteSizeLong() const {
// @@protoc_insertion_point(message_byte_size_start:CoreML.Specification.NonMaximumSuppression)
  size_t total_size = 0;

  // string confidenceInputFeatureName = 200;
  if (this->confidenceinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->confidenceinputfeaturename());
  }

  // string coordinatesInputFeatureName = 201;
  if (this->coordinatesinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->coordinatesinputfeaturename());
  }

  // string iouThresholdInputFeatureName = 202;
  if (this->iouthresholdinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->iouthresholdinputfeaturename());
  }

  // string confidenceThresholdInputFeatureName = 203;
  if (this->confidencethresholdinputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->confidencethresholdinputfeaturename());
  }

  // string confidenceOutputFeatureName = 210;
  if (this->confidenceoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->confidenceoutputfeaturename());
  }

  // string coordinatesOutputFeatureName = 211;
  if (this->coordinatesoutputfeaturename().size() > 0) {
    total_size += 2 +
      ::google::protobuf::internal::WireFormatLite::StringSize(
        this->coordinatesoutputfeaturename());
  }

  // double iouThreshold = 110;
  if (this->iouthreshold() != 0) {
    total_size += 2 + 8;
  }

  // double confidenceThreshold = 111;
  if (this->confidencethreshold() != 0) {
    total_size += 2 + 8;
  }

  switch (SuppressionMethod_case()) {
    // .CoreML.Specification.NonMaximumSuppression.PickTop pickTop = 1;
    case kPickTop: {
      total_size += 1 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *SuppressionMethod_.picktop_);
      break;
    }
    case SUPPRESSIONMETHOD_NOT_SET: {
      break;
    }
  }
  switch (ClassLabels_case()) {
    // .CoreML.Specification.StringVector stringClassLabels = 100;
    case kStringClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.stringclasslabels_);
      break;
    }
    // .CoreML.Specification.Int64Vector int64ClassLabels = 101;
    case kInt64ClassLabels: {
      total_size += 2 +
        ::google::protobuf::internal::WireFormatLite::MessageSizeNoVirtual(
          *ClassLabels_.int64classlabels_);
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
  int cached_size = ::google::protobuf::internal::ToCachedSize(total_size);
  GOOGLE_SAFE_CONCURRENT_WRITES_BEGIN();
  _cached_size_ = cached_size;
  GOOGLE_SAFE_CONCURRENT_WRITES_END();
  return total_size;
}